

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_elecshield(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  AFFECT_DATA af;
  
  bVar1 = is_affected(ch,sn);
  if (bVar1) {
    send_to_char("You are already surrounded by a shield of electricity.\n\r",ch);
    return;
  }
  init_affect(&af);
  af.where = 0;
  af.aftype = 0;
  af.type = (short)sn;
  af.level = (short)level;
  af.duration = (short)(level / 4);
  af.location = 0;
  af.modifier = 0;
  af.mod_name = 8;
  affect_to_char(ch,&af);
  send_to_char("You create an electrically-charged sphere around you.\n\r",ch);
  act("A crackling sphere of electricity briefly surrounds $n.",ch,(void *)0x0,(void *)0x0,0);
  return;
}

Assistant:

void spell_elecshield(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, sn))
	{
		send_to_char("You are already surrounded by a shield of electricity.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.modifier = 0;
	af.level = level;
	af.duration = level / 4;
	af.location = 0;
	af.mod_name = MOD_PROTECTION;
	affect_to_char(ch, &af);

	send_to_char("You create an electrically-charged sphere around you.\n\r", ch);
	act("A crackling sphere of electricity briefly surrounds $n.", ch, 0, 0, TO_ROOM);
}